

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastV64R1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  RepeatedField<unsigned_long> *this;
  ParseContext *pPVar1;
  MessageLite *pMVar2;
  uint64_t uVar3;
  TcParseTableBase *this_00;
  uchar uVar4;
  int8_t iVar5;
  byte bVar6;
  bool bVar7;
  uint16_t uVar8;
  unsigned_short uVar9;
  uint uVar10;
  char *pcVar11;
  unsigned_long value;
  uint *puVar12;
  ulong uVar13;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_340;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_338;
  unsigned_long local_330;
  unsigned_long tmp;
  RepeatedField<unsigned_long> *pRStack_320;
  uchar expected_tag;
  RepeatedField<unsigned_long> *field;
  uint64_t local_310;
  TcParseTableBase *local_308;
  ParseContext *local_300;
  char *local_2f8;
  MessageLite *local_2f0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2e8;
  TcFieldData local_2e0;
  TcFieldData local_2d8;
  undefined1 local_2c9;
  uint64_t uStack_2c8;
  bool always_return;
  TcParseTableBase *local_2c0;
  ParseContext *local_2b8;
  char *local_2b0;
  MessageLite *local_2a8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2a0;
  ulong local_298;
  int64_t res;
  char *local_288;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_280;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_278;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  uint32_t has_bits_offset_1;
  ulong local_188;
  int64_t res3;
  int64_t res2;
  anon_class_8_1_54a39810 last;
  anon_class_8_1_54a39810 next;
  bool kIs32BitVarint;
  bool kIs64BitVarint;
  char *local_158;
  char *local_150;
  int64_t *local_148;
  int8_t local_131;
  ulong *local_130;
  int8_t local_119;
  int64_t *local_118;
  int8_t local_101;
  ulong *local_100;
  int8_t local_e9;
  int8_t local_d9;
  int8_t local_c9;
  int8_t local_b9;
  int8_t local_a9;
  int64_t *local_a8;
  int8_t local_91;
  ulong *local_90;
  int8_t local_79;
  int64_t *local_78;
  int8_t local_61;
  ulong *local_60;
  int8_t local_49;
  int8_t local_39;
  int8_t local_29;
  int8_t local_19;
  int8_t local_9;
  
  local_310 = hasbits;
  local_308 = table;
  local_300 = ctx;
  local_2f8 = ptr;
  local_2f0 = msg;
  local_2e8 = data.field_0;
  uVar4 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)&local_2e8);
  pMVar2 = local_2f0;
  pcVar11 = local_2f8;
  pPVar1 = local_300;
  if (uVar4 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&field);
    pcVar11 = MiniParse(pMVar2,pcVar11,pPVar1,(TcFieldData)field,local_308,local_310);
    return pcVar11;
  }
  uVar8 = TcFieldData::offset((TcFieldData *)&local_2e8);
  pRStack_320 = RefAt<google::protobuf::RepeatedField<unsigned_long>>(pMVar2,(ulong)uVar8);
  tmp._7_1_ = UnalignedLoad<unsigned_char>(local_2f8);
  do {
    local_2f8 = local_2f8 + 1;
    res = (int64_t)&local_330;
    last.p = &local_158;
    res2 = (int64_t)&local_158;
    local_288 = local_2f8;
    local_158 = local_2f8;
    iVar5 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last);
    local_298 = (ulong)iVar5;
    if (iVar5 < '\0') {
      local_131 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last)
      ;
      local_148 = &res3;
      res3 = (long)local_131 << 7 | local_298 >> 0x39;
      local_d9 = local_131;
      if (res3 < 0) {
        local_119 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                              (&last);
        local_130 = &local_188;
        local_188 = (long)local_119 << 0xe | local_298 >> 0x32;
        local_c9 = local_119;
        if ((long)local_188 < 0) {
          local_101 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                (&last);
          local_118 = &res3;
          res3 = ((long)local_101 << 0x15 | local_298 >> 0x2b) & res3;
          local_b9 = local_101;
          if (res3 < 0) {
            local_e9 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                 (&last);
            local_100 = &local_188;
            local_188 = ((long)local_e9 << 0x1c | local_298 >> 0x24) & local_188;
            local_a9 = local_e9;
            if ((long)local_188 < 0) {
              local_91 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                   (&last);
              local_a8 = &res3;
              res3 = ((long)local_91 << 0x23 | local_298 >> 0x1d) & res3;
              local_39 = local_91;
              if (res3 < 0) {
                local_79 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                           operator()(&last);
                local_90 = &local_188;
                local_188 = ((long)local_79 << 0x2a | local_298 >> 0x16) & local_188;
                local_29 = local_79;
                if ((long)local_188 < 0) {
                  local_61 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                             operator()(&last);
                  local_78 = &res3;
                  res3 = ((long)local_61 << 0x31 | local_298 >> 0xf) & res3;
                  local_19 = local_61;
                  if (res3 < 0) {
                    local_49 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                               operator()(&last);
                    local_60 = &local_188;
                    local_188 = ((long)local_49 << 0x38 | local_298 >> 8) & local_188;
                    local_9 = local_49;
                    if (((long)local_188 < 0) &&
                       (iVar5 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                                operator()(&last), iVar5 != '\x01')) {
                      iVar5 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                              operator()((anon_class_8_1_54a39810 *)&res2);
                      if (((int)iVar5 & 0x80U) != 0) {
                        local_150 = (char *)0x0;
                        goto LAB_0036e416;
                      }
                      bVar6 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                              operator()((anon_class_8_1_54a39810 *)&res2);
                      if ((bVar6 & 1) == 0) {
                        local_188 = local_188 ^ 0x8000000000000000;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        res3 = local_188 & res3;
      }
      local_298 = res3 & local_298;
      if (local_158 == (char *)0x0) {
        protobuf_assumption_failed
                  ("p != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/varint_shuffle.h"
                   ,0x91);
      }
      local_150 = local_158;
    }
    else {
      local_150 = local_158;
    }
LAB_0036e416:
    local_288 = local_150;
    *(ulong *)res = local_298;
    pMVar2 = local_2f0;
    pPVar1 = local_300;
    this = pRStack_320;
    local_2f8 = local_288;
    if (local_288 == (char *)0x0) {
      TcFieldData::TcFieldData((TcFieldData *)&local_338);
      pcVar11 = Error(pMVar2,(char *)0x0,pPVar1,(TcFieldData)local_338,local_308,local_310);
      return pcVar11;
    }
    value = (anonymous_namespace)::ZigZagDecodeHelper<unsigned_long,false>(local_330);
    RepeatedField<unsigned_long>::Add(this,value);
    bVar7 = EpsCopyInputStream::DataAvailable(&local_300->super_EpsCopyInputStream,local_2f8);
    pMVar2 = local_2f0;
    pcVar11 = local_2f8;
    if (((bVar7 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(&local_340);
      if (local_308->has_bits_offset != 0) {
        uVar10 = (uint)local_310;
        puVar12 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_308->has_bits_offset);
        *puVar12 = uVar10 | *puVar12;
      }
      return pcVar11;
    }
    uVar4 = UnalignedLoad<unsigned_char>(local_2f8);
    local_2a8 = local_2f0;
    local_2b0 = local_2f8;
    local_2b8 = local_300;
    if (uVar4 != tmp._7_1_) {
      TcFieldData::TcFieldData(&data_local);
      local_2a0 = data_local.field_0;
      local_2c0 = local_308;
      uStack_2c8 = local_310;
      local_2c9 = 0;
      bVar7 = EpsCopyInputStream::DataAvailable(&local_2b8->super_EpsCopyInputStream,local_2b0);
      pMVar2 = local_2a8;
      pcVar11 = local_2b0;
      pPVar1 = local_2b8;
      if (!bVar7) {
        TcFieldData::TcFieldData(&local_2d8);
        if (local_2c0->has_bits_offset != 0) {
          uVar10 = (uint)uStack_2c8;
          puVar12 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_2c0->has_bits_offset);
          *puVar12 = uVar10 | *puVar12;
        }
        return pcVar11;
      }
      TcFieldData::TcFieldData(&local_2e0);
      this_00 = local_2c0;
      uVar3 = uStack_2c8;
      uVar9 = UnalignedLoad<unsigned_short>(pcVar11);
      uVar13 = (ulong)(int)((uint)uVar9 & (uint)this_00->fast_idx_mask);
      if ((uVar13 & 7) == 0) {
        data_1.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             TcParseTableBase::fast_entry(this_00,uVar13 >> 3);
        local_278.data =
             ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
             (ulong)uVar9;
        UNRECOVERED_JUMPTABLE =
             TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
        local_280.data = local_278.data;
        pcVar11 = (*UNRECOVERED_JUMPTABLE)
                            (pMVar2,pcVar11,pPVar1,(TcFieldData)local_278,this_00,uVar3);
        return pcVar11;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV64R1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedVarint<uint64_t, uint8_t>(
      PROTOBUF_TC_PARAM_PASS);
}